

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,string *name,PlaceholderType placeholder_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char *pcVar3;
  Tables *pTVar4;
  pointer pcVar5;
  bool bVar6;
  string *psVar7;
  long lVar8;
  FileDescriptor *pFVar9;
  anon_union_8_8_13f84498_for_Symbol_2 aVar10;
  EnumOptions *pEVar11;
  undefined8 *puVar12;
  MessageOptions *pMVar13;
  EnumValueOptions *pEVar14;
  size_type sVar15;
  bool bVar16;
  undefined8 uVar17;
  Symbol SVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_68;
  string *local_48;
  string *local_40;
  PlaceholderType local_34;
  
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  if (name->_M_string_length != 0) {
    pcVar3 = (name->_M_dataplus)._M_p;
    sVar15 = 0;
    bVar16 = false;
    do {
      bVar2 = pcVar3[sVar15];
      if ((char)bVar2 < 'a') {
        if ((char)bVar2 < 'A') {
          if ((char)bVar2 < '0') {
            if ((bVar2 != 0x2e) || (bVar6 = true, bVar16)) goto LAB_002decd0;
          }
          else {
            bVar6 = false;
            if (0x39 < bVar2) goto LAB_002decd0;
          }
        }
        else {
          bVar6 = false;
          if (bVar2 != 0x5f && 0x5a < bVar2) goto LAB_002decd0;
        }
      }
      else {
        bVar6 = false;
        if (0x7a < bVar2) goto LAB_002decd0;
      }
      sVar15 = sVar15 + 1;
      bVar16 = bVar6;
    } while (name->_M_string_length != sVar15);
    if (!bVar6) {
      pTVar4 = (this->tables_).ptr_;
      if (*pcVar3 == '.') {
        if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
        psVar7 = Tables::AllocateString(pTVar4,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
        psVar7 = Tables::AllocateString(pTVar4,name);
      }
      lVar8 = std::__cxx11::string::rfind((char)psVar7,0x2e);
      if (lVar8 == -1) {
        local_40 = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
        local_48 = psVar7;
        if (internal::empty_string_once_init_ != 2) {
          local_68._M_dataplus._M_p = (pointer)&PTR__FunctionClosure0_004241b8;
          local_68._M_string_length = (size_type)internal::InitEmptyString;
          local_68.field_2._M_local_buf[0] = '\0';
          GoogleOnceInitImpl(&internal::empty_string_once_init_,(Closure *)&local_68);
          internal::FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)&local_68);
        }
      }
      else {
        pTVar4 = (this->tables_).ptr_;
        local_34 = placeholder_type;
        if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar7);
        local_40 = Tables::AllocateString(pTVar4,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
        pTVar4 = (this->tables_).ptr_;
        if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
        std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar7);
        local_48 = Tables::AllocateString(pTVar4,&local_68);
        placeholder_type = local_34;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      paVar1 = &local_68.field_2;
      pcVar5 = (psVar7->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar5,pcVar5 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_68);
      pFVar9 = NewPlaceholderFileWithMutexHeld(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      *(string **)(pFVar9 + 8) = local_40;
      if (placeholder_type == PLACEHOLDER_ENUM) {
        *(undefined4 *)(pFVar9 + 0x68) = 1;
        pTVar4 = (this->tables_).ptr_;
        if (pTVar4 != (Tables *)0x0) {
          aVar10.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar4,0x38);
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar9 + 0x70))->descriptor =
               (Descriptor *)aVar10;
          *(undefined8 *)(aVar10.descriptor + 0x18) = 0;
          *(undefined8 *)(aVar10.descriptor + 0x20) = 0;
          *(undefined8 *)(aVar10.descriptor + 0x28) = 0;
          *(undefined8 *)(aVar10.descriptor + 0x30) = 0;
          *(string **)(aVar10.descriptor + 8) = psVar7;
          *(string **)aVar10.descriptor = local_48;
          *(FileDescriptor **)(aVar10.descriptor + 0x10) = pFVar9;
          pEVar11 = EnumOptions::default_instance();
          *(EnumOptions **)(aVar10.descriptor + 0x20) = pEVar11;
          aVar10.descriptor[0x28] = (Descriptor)0x1;
          aVar10.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          *(undefined4 *)(aVar10.descriptor + 0x2c) = 1;
          pTVar4 = (this->tables_).ptr_;
          if (pTVar4 != (Tables *)0x0) {
            puVar12 = (undefined8 *)Tables::AllocateBytes(pTVar4,0x28);
            *(undefined8 **)(aVar10.descriptor + 0x30) = puVar12;
            *puVar12 = 0;
            puVar12[1] = 0;
            puVar12[2] = 0;
            puVar12[3] = 0;
            puVar12[4] = 0;
            pTVar4 = (this->tables_).ptr_;
            if (pTVar4 != (Tables *)0x0) {
              local_68._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"PLACEHOLDER_VALUE","");
              psVar7 = Tables::AllocateString(pTVar4,&local_68);
              *puVar12 = psVar7;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p,
                                CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                         local_68.field_2._M_local_buf[0]) + 1);
              }
              if (local_40->_M_string_length == 0) {
                puVar12[1] = *puVar12;
              }
              else {
                pTVar4 = (this->tables_).ptr_;
                if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
                pcVar5 = (local_40->_M_dataplus)._M_p;
                local_68._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,pcVar5,pcVar5 + local_40->_M_string_length);
                std::__cxx11::string::append((char *)&local_68);
                psVar7 = Tables::AllocateString(pTVar4,&local_68);
                puVar12[1] = psVar7;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != paVar1) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                           local_68.field_2._M_local_buf[0]) + 1);
                }
              }
              *(undefined4 *)(puVar12 + 2) = 0;
              ((anon_union_8_8_13f84498_for_Symbol_2 *)(puVar12 + 3))->descriptor =
                   (Descriptor *)aVar10;
              pEVar14 = EnumValueOptions::default_instance();
              puVar12[4] = pEVar14;
              uVar17 = 4;
              goto LAB_002decd3;
            }
          }
        }
LAB_002df0fe:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      *(undefined4 *)(pFVar9 + 0x58) = 1;
      pTVar4 = (this->tables_).ptr_;
      if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
      aVar10.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar4,0xa8);
      ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar9 + 0x60))->descriptor = (Descriptor *)aVar10;
      memset(aVar10.descriptor + 0x18,0,0x90);
      *(string **)(aVar10.descriptor + 8) = psVar7;
      *(string **)aVar10.descriptor = local_48;
      *(FileDescriptor **)(aVar10.descriptor + 0x10) = pFVar9;
      pMVar13 = MessageOptions::default_instance();
      *(MessageOptions **)(aVar10.descriptor + 0x20) = pMVar13;
      aVar10.descriptor[0x28] = (Descriptor)0x1;
      aVar10.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      uVar17 = 1;
      if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(aVar10.descriptor + 0x68) = 1;
        pTVar4 = (this->tables_).ptr_;
        if (pTVar4 == (Tables *)0x0) goto LAB_002df0fe;
        puVar12 = (undefined8 *)Tables::AllocateBytes(pTVar4,8);
        *(undefined8 **)(aVar10.descriptor + 0x70) = puVar12;
        *puVar12 = 0x2000000000000001;
      }
      goto LAB_002decd3;
    }
  }
LAB_002decd0:
  uVar17 = 0;
  aVar10.descriptor = (Descriptor *)0x0;
LAB_002decd3:
  SVar18.field_1.descriptor = aVar10.descriptor;
  SVar18._0_8_ = uVar17;
  return SVar18;
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    const string& name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  const string* placeholder_full_name;
  const string* placeholder_name;
  const string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = tables_->AllocateString(name.substr(1));
  } else {
    placeholder_full_name = tables_->AllocateString(name);
  }

  string::size_type dotpos = placeholder_full_name->find_last_of('.');
  if (dotpos != string::npos) {
    placeholder_package = tables_->AllocateString(
      placeholder_full_name->substr(0, dotpos));
    placeholder_name = tables_->AllocateString(
      placeholder_full_name->substr(dotpos + 1));
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      *placeholder_full_name + ".placeholder.proto");
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ =
      tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(placeholder_enum, 0, sizeof(*placeholder_enum));

    placeholder_enum->full_name_ = placeholder_full_name;
    placeholder_enum->name_ = placeholder_name;
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(placeholder_value, 0, sizeof(*placeholder_value));

    placeholder_value->name_ = tables_->AllocateString("PLACEHOLDER_VALUE");
    // Note that enum value names are siblings of their type, not children.
    placeholder_value->full_name_ =
      placeholder_package->empty() ? placeholder_value->name_ :
        tables_->AllocateString(*placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ =
      tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(placeholder_message, 0, sizeof(*placeholder_message));

    placeholder_message->full_name_ = placeholder_full_name;
    placeholder_message->name_ = placeholder_name;
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
        tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
        FieldDescriptor::kMaxNumber + 1;
    }

    return Symbol(placeholder_message);
  }
}